

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_find_best_obmc_sub_pixel_tree_up
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  SubpelMvLimits *mv_limits;
  byte bVar1;
  SUBPEL_SEARCH_TYPE SVar2;
  MV_COST_TYPE MVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  buf_2d *pbVar7;
  MV *pMVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  uint uVar19;
  short sVar20;
  short sVar21;
  uint local_a4;
  MV diag_mv;
  MV top_mv;
  MV right_mv;
  int dummy;
  MV left_mv;
  MV bottom_mv;
  int local_40;
  
  bVar1 = ms_params->forced_stop;
  iVar6 = ms_params->iters_per_step;
  mv_cost_params = &ms_params->mv_cost_params;
  iVar9 = 3 - (uint)bVar1;
  local_40 = 3 - (uint)(ms_params->allow_hp == 0);
  var_params = &ms_params->var_params;
  if (iVar9 < local_40) {
    local_40 = iVar9;
  }
  SVar2 = (ms_params->var_params).subpel_search_type;
  local_a4 = 0x7fffffff;
  *bestmv = start_mv;
  if (SVar2 == '\0') {
    pbVar7 = (ms_params->var_params).ms_buffers.ref;
    local_a4 = (*((ms_params->var_params).vfp)->ovf)
                         (pbVar7->buf,pbVar7->stride,(ms_params->var_params).ms_buffers.wsrc,
                          (ms_params->var_params).ms_buffers.obmc_mask,sse1);
  }
  else {
    local_a4 = upsampled_obmc_pref_error(xd,cm,bestmv,var_params,sse1);
  }
  *distortion = local_a4;
  MVar3 = (ms_params->mv_cost_params).mv_cost_type;
  iVar9 = 0;
  if (MVar3 != '\x04') {
    sVar17 = mv_cost_params->ref_mv->row;
    sVar15 = bestmv->row - sVar17;
    sVar16 = mv_cost_params->ref_mv->col;
    sVar20 = bestmv->col - sVar16;
    sVar18 = -sVar15;
    if (0 < sVar15) {
      sVar18 = sVar15;
    }
    sVar21 = -sVar20;
    if (0 < sVar20) {
      sVar21 = sVar20;
    }
    if (MVar3 == '\x03') {
      iVar9 = (int)sVar21 + (int)sVar18 >> 3;
    }
    else if (MVar3 == '\x01') {
      iVar9 = (int)sVar21 + (int)sVar18 >> 2;
    }
    else if (MVar3 == '\0') {
      iVar9 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar20] +
                     (long)(ms_params->mv_cost_params).mvcost[0][sVar15] +
                    (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                  (ulong)((uint)(bestmv->col != sVar16) * 4 +
                                         (uint)(bestmv->row != sVar17) * 8))) *
                    (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
    }
  }
  local_a4 = iVar9 + local_a4;
  if (bVar1 < 3) {
    mv_limits = &ms_params->mv_limits;
    uVar19 = 4;
    do {
      uVar4 = bestmv->row;
      uVar5 = bestmv->col;
      dummy = 0;
      left_mv.col = (int16_t)(uVar5 - uVar19);
      left_mv.row = uVar4;
      sVar17 = (short)uVar19;
      right_mv.col = uVar5 + sVar17;
      right_mv.row = uVar4;
      top_mv.col = uVar5;
      top_mv.row = uVar4 - sVar17;
      bottom_mv.col = uVar5;
      bottom_mv.row = uVar4 + sVar17;
      if ((ms_params->var_params).subpel_search_type == '\0') {
        uVar14 = 0x7fffffff;
        if ((((mv_limits->col_min <= (int)left_mv.col) &&
             ((int)left_mv.col <= (ms_params->mv_limits).col_max)) &&
            ((ms_params->mv_limits).row_min <= (int)(short)uVar4)) &&
           ((int)(short)uVar4 <= (ms_params->mv_limits).row_max)) {
          pbVar7 = (ms_params->var_params).ms_buffers.ref;
          iVar9 = pbVar7->stride;
          uVar10 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar7->buf +
                              (((int)left_mv.col >> 3) + (((int)left_mv << 0x10) >> 0x13) * iVar9),
                              iVar9,uVar5 - uVar19 & 7,uVar4 & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar9 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar8 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (left_mv.col - pMVar8->col) * 8;
            sVar16 = (left_mv.row - pMVar8->row) * 8;
            iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar14 = iVar9 + uVar10;
          if (uVar14 < local_a4) {
            *bestmv = left_mv;
            *distortion = uVar10;
            *sse1 = (uint)diag_mv;
            dummy = 1;
            local_a4 = uVar14;
          }
        }
        uVar10 = 0x7fffffff;
        if (((mv_limits->col_min <= (int)right_mv >> 0x10) &&
            ((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
           (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
            ((int)right_mv.row <= (ms_params->mv_limits).row_max)))) {
          pbVar7 = (ms_params->var_params).ms_buffers.ref;
          iVar9 = pbVar7->stride;
          uVar11 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar7->buf +
                              (((int)right_mv >> 0x13) + (((int)right_mv << 0x10) >> 0x13) * iVar9),
                              iVar9,(uint)right_mv >> 0x10 & 7,(uint)right_mv & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar9 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar8 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (right_mv.col - pMVar8->col) * 8;
            sVar16 = (right_mv.row - pMVar8->row) * 8;
            iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar10 = iVar9 + uVar11;
          if (uVar10 < local_a4) {
            *bestmv = right_mv;
            *distortion = uVar11;
            *sse1 = (uint)diag_mv;
            dummy = dummy | 1;
            local_a4 = uVar10;
          }
        }
        uVar12 = 0x7fffffff;
        uVar11 = 0x7fffffff;
        if (((mv_limits->col_min <= (int)top_mv >> 0x10) &&
            ((int)top_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
           (((ms_params->mv_limits).row_min <= (int)top_mv.row &&
            ((int)top_mv.row <= (ms_params->mv_limits).row_max)))) {
          pbVar7 = (ms_params->var_params).ms_buffers.ref;
          iVar9 = pbVar7->stride;
          uVar13 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar7->buf +
                              (((int)top_mv >> 0x13) + (((int)top_mv << 0x10) >> 0x13) * iVar9),
                              iVar9,(uint)top_mv >> 0x10 & 7,(uint)top_mv & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar9 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar8 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (top_mv.col - pMVar8->col) * 8;
            sVar16 = (top_mv.row - pMVar8->row) * 8;
            iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar11 = iVar9 + uVar13;
          if (uVar11 < local_a4) {
            *bestmv = top_mv;
            *distortion = uVar13;
            *sse1 = (uint)diag_mv;
            dummy = dummy | 1;
            local_a4 = uVar11;
          }
        }
        if ((((mv_limits->col_min <= (int)bottom_mv >> 0x10) &&
             ((int)bottom_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
            ((ms_params->mv_limits).row_min <= (int)bottom_mv.row)) &&
           ((int)bottom_mv.row <= (ms_params->mv_limits).row_max)) {
          pbVar7 = (ms_params->var_params).ms_buffers.ref;
          iVar9 = pbVar7->stride;
          uVar13 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar7->buf +
                              (((int)bottom_mv >> 0x13) + (((int)bottom_mv << 0x10) >> 0x13) * iVar9
                              ),iVar9,(uint)bottom_mv >> 0x10 & 7,(uint)bottom_mv & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar9 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar8 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (bottom_mv.col - pMVar8->col) * 8;
            sVar16 = (bottom_mv.row - pMVar8->row) * 8;
            iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar12 = iVar9 + uVar13;
          if (uVar12 < local_a4) {
            *bestmv = bottom_mv;
            *distortion = uVar13;
            *sse1 = (uint)diag_mv;
            dummy = dummy | 1;
            local_a4 = uVar12;
          }
        }
        uVar13 = uVar19;
        if (uVar11 <= uVar12) {
          uVar13 = -uVar19;
        }
        uVar11 = uVar19;
        if (uVar14 <= uVar10) {
          uVar11 = -uVar19;
        }
        uVar10 = uVar13 & 0xffff | uVar11 << 0x10;
        sVar17 = (short)(uVar11 + uVar5);
        uVar14 = (uint)sVar17;
        if ((mv_limits->col_min <= (int)uVar14) && ((int)uVar14 <= (ms_params->mv_limits).col_max))
        {
          uVar13 = uVar13 + uVar4;
          sVar16 = (short)uVar13;
          if (((ms_params->mv_limits).row_min <= (int)sVar16) &&
             ((int)sVar16 <= (ms_params->mv_limits).row_max)) {
            uVar11 = (uVar11 + uVar5) * 0x10000;
            pbVar7 = (ms_params->var_params).ms_buffers.ref;
            iVar9 = pbVar7->stride;
            uVar14 = (*((ms_params->var_params).vfp)->osvf)
                               (pbVar7->buf +
                                (((int)uVar11 >> 0x13) +
                                ((int)((uVar13 & 0xffff) << 0x10) >> 0x13) * iVar9),iVar9,uVar14 & 7
                                ,uVar13 & 7,(ms_params->var_params).ms_buffers.wsrc,
                                (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
            iVar9 = 0;
            if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
              pMVar8 = (ms_params->mv_cost_params).ref_mv;
              sVar18 = (sVar17 - pMVar8->col) * 8;
              sVar17 = (sVar16 - pMVar8->row) * 8;
              iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar17] +
                       *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                               (ulong)((uint)(sVar18 != 0) * 4 + (uint)(sVar17 != 0) * 8)) +
                      (ms_params->mv_cost_params).mvcost[1][sVar18]) *
                      (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
            }
            if (iVar9 + uVar14 < local_a4) {
              *bestmv = (MV)(uVar11 | uVar13 & 0xffff);
              *distortion = uVar14;
              *sse1 = (uint)diag_mv;
              local_a4 = iVar9 + uVar14;
            }
          }
        }
      }
      else {
        uVar10 = obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a4,sse1,distortion,&dummy);
        uVar11 = obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a4,sse1,distortion,&dummy);
        uVar12 = obmc_check_better(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a4,sse1,distortion,&dummy);
        uVar13 = obmc_check_better(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a4,sse1,distortion,&dummy);
        uVar14 = uVar19;
        if (uVar12 <= uVar13) {
          uVar14 = -uVar19;
        }
        uVar12 = uVar19;
        if (uVar10 <= uVar11) {
          uVar12 = -uVar19;
        }
        uVar10 = uVar14 & 0xffff | uVar12 << 0x10;
        diag_mv.col = (short)uVar12 + uVar5;
        diag_mv.row = (short)uVar14 + uVar4;
        obmc_check_better(xd,cm,&diag_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a4,sse1,
                          distortion,&dummy);
      }
      left_mv.row = bestmv->row;
      if (uVar4 == left_mv.row) {
        if (uVar5 != bestmv->col && 1 < iVar6) {
LAB_001d64f3:
          sVar17 = (short)(uVar10 >> 0x10);
          if (uVar4 == left_mv.row) {
            if (uVar5 == bestmv->col) goto LAB_001d69c3;
            if (uVar4 != left_mv.row) goto LAB_001d6515;
            uVar10 = -uVar10;
          }
          else {
LAB_001d6515:
            if (uVar5 == bestmv->col) {
              sVar17 = -sVar17;
            }
          }
          right_mv.row = (short)uVar10 + left_mv.row;
          uVar4 = bestmv->col;
          dummy = CONCAT22(uVar4,right_mv.row);
          left_mv.col = sVar17 + uVar4;
          right_mv.col = sVar17 + uVar4;
          top_mv.row = 0;
          top_mv.col = 0;
          if ((ms_params->var_params).subpel_search_type == '\0') {
            if (((mv_limits->col_min <= (int)(short)uVar4) &&
                ((int)(short)uVar4 <= (ms_params->mv_limits).col_max)) &&
               (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
                ((int)right_mv.row <= (ms_params->mv_limits).row_max)))) {
              pbVar7 = (ms_params->var_params).ms_buffers.ref;
              iVar9 = pbVar7->stride;
              uVar14 = (*((ms_params->var_params).vfp)->osvf)
                                 (pbVar7->buf +
                                  (((int)(short)uVar4 >> 3) + ((dummy << 0x10) >> 0x13) * iVar9),
                                  iVar9,uVar4 & 7,(ushort)right_mv.row & 7,
                                  (ms_params->var_params).ms_buffers.wsrc,
                                  (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar9 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar8 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (dummy._2_2_ - pMVar8->col) * 8;
                sVar16 = ((short)dummy - pMVar8->row) * 8;
                iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              if (iVar9 + uVar14 < local_a4) {
                bestmv->row = (short)dummy;
                bestmv->col = dummy._2_2_;
                *distortion = uVar14;
                *sse1 = (uint)diag_mv;
                top_mv.row = 1;
                top_mv.col = 0;
                local_a4 = iVar9 + uVar14;
              }
            }
            if ((((mv_limits->col_min <= (int)left_mv >> 0x10) &&
                 ((int)left_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
                ((ms_params->mv_limits).row_min <= (int)left_mv.row)) &&
               ((int)left_mv.row <= (ms_params->mv_limits).row_max)) {
              pbVar7 = (ms_params->var_params).ms_buffers.ref;
              iVar9 = pbVar7->stride;
              uVar14 = (*((ms_params->var_params).vfp)->osvf)
                                 (pbVar7->buf +
                                  (((int)left_mv >> 0x13) + (((int)left_mv << 0x10) >> 0x13) * iVar9
                                  ),iVar9,(uint)left_mv >> 0x10 & 7,(uint)left_mv & 7,
                                  (ms_params->var_params).ms_buffers.wsrc,
                                  (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar9 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar8 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (left_mv.col - pMVar8->col) * 8;
                sVar16 = (left_mv.row - pMVar8->row) * 8;
                iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              if (iVar9 + uVar14 < local_a4) {
                *bestmv = left_mv;
                *distortion = uVar14;
                *sse1 = (uint)diag_mv;
                top_mv = (MV)((uint)top_mv | 1);
                local_a4 = iVar9 + uVar14;
              }
            }
            if (((top_mv != (MV)0x0) && (mv_limits->col_min <= (int)right_mv >> 0x10)) &&
               (((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max &&
                (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
                 ((int)right_mv.row <= (ms_params->mv_limits).row_max)))))) {
              pbVar7 = (ms_params->var_params).ms_buffers.ref;
              iVar9 = pbVar7->stride;
              uVar14 = (*((ms_params->var_params).vfp)->osvf)
                                 (pbVar7->buf +
                                  (((int)right_mv >> 0x13) +
                                  (((int)right_mv << 0x10) >> 0x13) * iVar9),iVar9,
                                  (uint)right_mv >> 0x10 & 7,(uint)right_mv & 7,
                                  (ms_params->var_params).ms_buffers.wsrc,
                                  (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar9 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar8 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (right_mv.col - pMVar8->col) * 8;
                sVar16 = (right_mv.row - pMVar8->row) * 8;
                iVar9 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              if (iVar9 + uVar14 < local_a4) {
                *bestmv = right_mv;
                *distortion = uVar14;
                *sse1 = (uint)diag_mv;
                local_a4 = iVar9 + uVar14;
              }
            }
          }
          else {
            obmc_check_better(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,
                              &local_a4,sse1,distortion,(int *)&top_mv);
            obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a4,
                              sse1,distortion,(int *)&top_mv);
            if (top_mv != (MV)0x0) {
              obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a4
                                ,sse1,distortion,(int *)&top_mv);
            }
          }
        }
      }
      else if (1 < iVar6) goto LAB_001d64f3;
LAB_001d69c3:
      uVar19 = uVar19 >> 1;
      local_40 = local_40 + -1;
    } while (local_40 != 0);
  }
  return local_a4;
}

Assistant:

int av1_find_best_obmc_sub_pixel_tree_up(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)last_mv_search_list;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  int hstep = INIT_SUBPEL_STEP_SIZE;
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);

  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  if (subpel_search_type != USE_2_TAPS_ORIG)
    besterr = upsampled_setup_obmc_center_error(
        xd, cm, bestmv, var_params, mv_cost_params, sse1, distortion);
  else
    besterr = setup_obmc_center_error(bestmv, var_params, mv_cost_params, sse1,
                                      distortion);

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    MV diag_step = obmc_first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                          mv_limits, var_params, mv_cost_params,
                                          &besterr, sse1, distortion);

    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      obmc_second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                                 mv_limits, var_params, mv_cost_params,
                                 &besterr, sse1, distortion);
    }
    hstep >>= 1;
  }

  return besterr;
}